

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O1

acmod_id_t
acmod_set_tri2id(acmod_set_t *acmod_set,acmod_id_t phone,acmod_id_t left_context,
                acmod_id_t right_context,word_posn_t posn)

{
  cell_index_t cVar1;
  
  if (acmod_set->n_multi != 0) {
    cVar1 = itree_find_tri(acmod_set->multi_idx[phone],left_context,right_context,posn);
    return cVar1;
  }
  return 0xffffffff;
}

Assistant:

acmod_id_t
acmod_set_tri2id(acmod_set_t *acmod_set,
		 acmod_id_t phone,
		 acmod_id_t left_context,
		 acmod_id_t right_context,
		 word_posn_t posn)
{
    itree_t *idx;
    cell_index_t i;

    if (acmod_set->n_multi == 0) {
	/* none defined */

	return NO_ACMOD;
    }

    idx = acmod_set->multi_idx[phone];

    i = itree_find_tri(idx, left_context, right_context, posn);

    if (i != NULL_INDEX)
	return i;
    else
	return NO_ACMOD;
}